

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::initialiseSolve(HEkkPrimal *this)

{
  int iVar1;
  HEkk *pHVar2;
  double dVar3;
  value_type_conflict1 in_RAX;
  HighsOptions *pHVar4;
  value_type_conflict1 local_18;
  
  pHVar2 = this->ekk_instance_;
  pHVar4 = pHVar2->options_;
  dVar3 = (pHVar4->super_HighsOptionsStruct).dual_feasibility_tolerance;
  this->primal_feasibility_tolerance =
       (pHVar4->super_HighsOptionsStruct).primal_feasibility_tolerance;
  this->dual_feasibility_tolerance = dVar3;
  this->objective_target = (pHVar4->super_HighsOptionsStruct).objective_target;
  (pHVar2->status_).has_dual_objective_value = false;
  (pHVar2->status_).has_primal_objective_value = false;
  pHVar2->model_status_ = kMin;
  pHVar2->solve_bailout_ = false;
  pHVar2->called_return_from_solve_ = false;
  pHVar2->exit_algorithm_ = kPrimal;
  this->rebuild_reason = 0;
  local_18 = in_RAX;
  if ((pHVar2->status_).has_dual_steepest_edge_weights == false) {
    local_18 = 1.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&pHVar2->dual_edge_weight_,(long)this->num_row,&local_18);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->ekk_instance_->scattered_dual_edge_weight_,(long)this->num_tot);
    pHVar4 = this->ekk_instance_->options_;
  }
  iVar1 = (pHVar4->super_HighsOptionsStruct).simplex_primal_edge_weight_strategy;
  if ((iVar1 == -1) || (iVar1 == 1)) {
    this->edge_weight_mode = kDevex;
    initialiseDevexFramework(this);
  }
  else if (iVar1 == 0) {
    this->edge_weight_mode = kDantzig;
    local_18 = 1.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->edge_weight_,(long)this->num_tot,&local_18);
  }
  else {
    this->edge_weight_mode = kSteepestEdge;
    computePrimalSteepestEdgeWeights(this);
  }
  return;
}

Assistant:

void HEkkPrimal::initialiseSolve() {
  // Copy values of simplex solver options to dual simplex options
  primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  dual_feasibility_tolerance =
      ekk_instance_.options_->dual_feasibility_tolerance;
  objective_target = ekk_instance_.options_->objective_target;

  ekk_instance_.status_.has_primal_objective_value = false;
  ekk_instance_.status_.has_dual_objective_value = false;

  ekk_instance_.model_status_ = HighsModelStatus::kNotset;
  ekk_instance_.solve_bailout_ = false;
  ekk_instance_.called_return_from_solve_ = false;
  ekk_instance_.exit_algorithm_ = SimplexAlgorithm::kPrimal;

  rebuild_reason = kRebuildReasonNo;
  if (!ekk_instance_.status_.has_dual_steepest_edge_weights) {
    // No dual weights to maintain, so ensure that the vectors are
    // assigned since they are used around factorization and when
    // setting up the backtracking information. ToDo Eliminate this
    // opacity
    ekk_instance_.dual_edge_weight_.assign(num_row, 1.0);
    ekk_instance_.scattered_dual_edge_weight_.resize(num_tot);
  }
  const HighsInt edge_weight_strategy =
      ekk_instance_.options_->simplex_primal_edge_weight_strategy;
  if (edge_weight_strategy == kSimplexEdgeWeightStrategyChoose ||
      edge_weight_strategy == kSimplexEdgeWeightStrategyDevex) {
    // By default, use Devex
    edge_weight_mode = EdgeWeightMode::kDevex;
  } else if (edge_weight_strategy == kSimplexEdgeWeightStrategyDantzig) {
    edge_weight_mode = EdgeWeightMode::kDantzig;
  } else {
    assert(edge_weight_strategy == kSimplexEdgeWeightStrategySteepestEdge);
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
  }
  if (edge_weight_mode == EdgeWeightMode::kDantzig) {
    edge_weight_.assign(num_tot, 1.0);
  } else if (edge_weight_mode == EdgeWeightMode::kDevex) {
    initialiseDevexFramework();
  } else if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    computePrimalSteepestEdgeWeights();
  }
}